

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  byte bVar4;
  ServerService service;
  sockaddr_in peerAddr;
  char msg [100];
  
  bVar4 = 0;
  ServerService::ServerService(&service,0x1ed8,0x14);
  pcVar2 = "BROADCAST FROM SERVER";
  pcVar3 = msg;
  for (lVar1 = 100; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pcVar3 = *pcVar2;
    pcVar2 = pcVar2 + (ulong)bVar4 * -2 + 1;
    pcVar3 = pcVar3 + (ulong)bVar4 * -2 + 1;
  }
  peerAddr = ServerService::initBroadcast(&service,0x2329);
  ServerService::startBroadcast(&service,&peerAddr,msg,5);
  ServerService::startBroadcast(&service,&peerAddr,msg,4);
  ServerService::startBroadcast(&service,&peerAddr,msg,3);
  ServerService::startBroadcast(&service,&peerAddr,msg,2);
  ServerService::startBroadcast(&service,&peerAddr,msg,1);
  ServerService::startBroadcast(&service,&peerAddr,msg,1);
  ServerService::startService(&service);
  ServerService::~ServerService(&service);
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {
    int port = 7896;
    int size = 20;
//    cout << "Please input port and window size:";
//    cin >> port >> size;
    ServerService service = ServerService(port, size);

    char msg[100] = "BROADCAST FROM SERVER";
    //初始化广播
    struct sockaddr_in peerAddr = service.initBroadcast(9001);
    //发送单条广播
    service.startBroadcast(&peerAddr, msg, 5);
    service.startBroadcast(&peerAddr, msg, 4);
    service.startBroadcast(&peerAddr, msg, 3);
    service.startBroadcast(&peerAddr, msg, 2);
    service.startBroadcast(&peerAddr, msg);
    service.startBroadcast(&peerAddr, msg);
    service.startService();
//    service.startControlService();
//    service.startControlServiceWithResult();
    return 0;
}